

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliCleanLZ77Store(ZopfliLZ77Store *store)

{
  undefined8 *in_RDI;
  
  free((void *)*in_RDI);
  free((void *)in_RDI[1]);
  free((void *)in_RDI[4]);
  free((void *)in_RDI[5]);
  free((void *)in_RDI[6]);
  free((void *)in_RDI[7]);
  free((void *)in_RDI[8]);
  return;
}

Assistant:

void ZopfliCleanLZ77Store(ZopfliLZ77Store* store) {
  free(store->litlens);
  free(store->dists);
  free(store->pos);
  free(store->ll_symbol);
  free(store->d_symbol);
  free(store->ll_counts);
  free(store->d_counts);
}